

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O2

void __thiscall
FileTest_MoveFromTemporaryInAssignmentClosesFile_Test::TestBody
          (FileTest_MoveFromTemporaryInAssignmentClosesFile_Test *this)

{
  file fd;
  int in_ESI;
  char *in_R9;
  file f;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  file f_1;
  undefined4 uStack_3c;
  AssertionResult gtest_ar_;
  
  open_file();
  fd = f;
  open_file();
  fmt::v5::file::close(&f,in_ESI);
  f = f_1;
  f_1.fd_ = -1;
  fmt::v5::file::~file(&f_1);
  gtest_ar_.success_ = isclosed(fd.fd_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&f_1,(internal *)&gtest_ar_,(AssertionResult *)"isclosed(old_fd)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-test.cc"
               ,0xec,(char *)CONCAT44(uStack_3c,f_1.fd_));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&f_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  fmt::v5::file::~file(&f);
  return;
}

Assistant:

TEST(FileTest, MoveFromTemporaryInAssignmentClosesFile) {
  int fd = 0xdead;
  file f = open_file();
  int old_fd = f.descriptor();
  f = OpenBufferedFile(fd);
  EXPECT_TRUE(isclosed(old_fd));
}